

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverse.h
# Opt level: O2

bool Gs::Inverse<float>(AffineMatrix4T<float> *inv,AffineMatrix4T<float> *m)

{
  float fVar1;
  float fVar2;
  
  fVar1 = Determinant<float>(m);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar2 = 1.0 / fVar1;
    inv->m_[0] = (m->m_[4] * m->m_[8] - m->m_[5] * m->m_[7]) * fVar2;
    inv->m_[1] = (m->m_[7] * m->m_[2] - m->m_[8] * m->m_[1]) * fVar2;
    inv->m_[2] = (m->m_[1] * m->m_[5] - m->m_[4] * m->m_[2]) * fVar2;
    inv->m_[3] = (m->m_[5] * m->m_[6] - m->m_[3] * m->m_[8]) * fVar2;
    inv->m_[4] = (m->m_[8] * m->m_[0] - m->m_[6] * m->m_[2]) * fVar2;
    inv->m_[5] = (m->m_[2] * m->m_[3] - m->m_[5] * m->m_[0]) * fVar2;
    inv->m_[6] = (m->m_[3] * m->m_[7] - m->m_[4] * m->m_[6]) * fVar2;
    inv->m_[7] = (m->m_[6] * m->m_[1] - m->m_[7] * m->m_[0]) * fVar2;
    inv->m_[8] = (m->m_[0] * m->m_[4] - m->m_[3] * m->m_[1]) * fVar2;
    inv->m_[9] = ((m->m_[7] * m->m_[9] - m->m_[10] * m->m_[6]) * m->m_[5] +
                 (m->m_[8] * m->m_[10] - m->m_[0xb] * m->m_[7]) * m->m_[3] +
                 (m->m_[0xb] * m->m_[6] - m->m_[8] * m->m_[9]) * m->m_[4]) * fVar2;
    inv->m_[10] = ((m->m_[1] * m->m_[9] - m->m_[10] * m->m_[0]) * m->m_[8] +
                  (m->m_[2] * m->m_[10] - m->m_[0xb] * m->m_[1]) * m->m_[6] +
                  (m->m_[0xb] * m->m_[0] - m->m_[2] * m->m_[9]) * m->m_[7]) * fVar2;
    inv->m_[0xb] = ((m->m_[1] * m->m_[3] - m->m_[4] * m->m_[0]) * m->m_[0xb] +
                   (m->m_[2] * m->m_[4] - m->m_[5] * m->m_[1]) * m->m_[9] +
                   (m->m_[5] * m->m_[0] - m->m_[2] * m->m_[3]) * m->m_[10]) * fVar2;
  }
  return (bool)(-(fVar1 != 0.0) & 1);
}

Assistant:

bool Inverse(AffineMatrix4T<T>& inv, const AffineMatrix4T<T>& m)
{
    /* Compute inverse determinant */
    T d = Determinant(m);

    if (d == T(0))
        return false;

    d = T(1) / d;

    /* Compute inverse matrix */
    inv.At(0, 0) = d * ( m.At(1, 1) * m.At(2, 2) + m.At(2, 1) * ( -m.At(1, 2) ) );
    inv.At(1, 0) = d * ( m.At(1, 2) * m.At(2, 0) + m.At(2, 2) * ( -m.At(1, 0) ) );
    inv.At(2, 0) = d * ( m.At(1, 0) * m.At(2, 1) - m.At(2, 0) * m.At(1, 1) );
  /*inv.At(3, 0) = 0;*/

    inv.At(0, 1) = d * ( m.At(2, 1) * m.At(0, 2) + m.At(0, 1) * ( -m.At(2, 2) ) );
    inv.At(1, 1) = d * ( m.At(2, 2) * m.At(0, 0) + m.At(0, 2) * ( -m.At(2, 0) ) );
    inv.At(2, 1) = d * ( m.At(2, 0) * m.At(0, 1) - m.At(0, 0) * m.At(2, 1) );
  /*inv.At(3, 1) = 0;*/

    inv.At(0, 2) = d * ( m.At(0, 1) * m.At(1, 2) + m.At(1, 1) * ( -m.At(0, 2) ) );
    inv.At(1, 2) = d * ( m.At(0, 2) * m.At(1, 0) + m.At(1, 2) * ( -m.At(0, 0) ) );
    inv.At(2, 2) = d * ( m.At(0, 0) * m.At(1, 1) - m.At(1, 0) * m.At(0, 1) );
  /*inv.At(3, 2) = 0;*/

    inv.At(0, 3) = d * ( m.At(0, 1) * (m.At(2, 2) * m.At(1, 3) - m.At(1, 2) * m.At(2, 3)) + m.At(1, 1) * (m.At(0, 2) * m.At(2, 3) - m.At(2, 2) * m.At(0, 3)) + m.At(2, 1) * (m.At(1, 2) * m.At(0, 3) - m.At(0, 2) * m.At(1, 3)) );
    inv.At(1, 3) = d * ( m.At(0, 2) * (m.At(2, 0) * m.At(1, 3) - m.At(1, 0) * m.At(2, 3)) + m.At(1, 2) * (m.At(0, 0) * m.At(2, 3) - m.At(2, 0) * m.At(0, 3)) + m.At(2, 2) * (m.At(1, 0) * m.At(0, 3) - m.At(0, 0) * m.At(1, 3)) );
    inv.At(2, 3) = d * ( m.At(0, 3) * (m.At(2, 0) * m.At(1, 1) - m.At(1, 0) * m.At(2, 1)) + m.At(1, 3) * (m.At(0, 0) * m.At(2, 1) - m.At(2, 0) * m.At(0, 1)) + m.At(2, 3) * (m.At(1, 0) * m.At(0, 1) - m.At(0, 0) * m.At(1, 1)) );
  /*inv.At(3, 3) = 1;*/

    return true;
}